

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimd.cpp
# Opt level: O1

qsizetype qRandomCpu(void *buffer,qsizetype count)

{
  uint *ptr;
  uint *puVar1;
  
  puVar1 = (uint *)((long)buffer + count * 4);
  ptr = (uint *)buffer;
  if (((uint)qt_cpu_features[0].super___atomic_base<unsigned_long>._M_i >> 0x11 & 1) != 0) {
    ptr = qt_random_rdseed((uint *)buffer,puVar1);
  }
  puVar1 = qt_random_rdrnd(ptr,puVar1);
  return (long)puVar1 - (long)buffer >> 2;
}

Assistant:

qsizetype qRandomCpu(void *buffer, qsizetype count) noexcept
{
    unsigned *ptr = reinterpret_cast<unsigned *>(buffer);
    unsigned *end = ptr + count;

    if (qCpuHasFeature(RDSEED))
        ptr = qt_random_rdseed(ptr, end);

    // fill the buffer with RDRND if RDSEED didn't
    ptr = qt_random_rdrnd(ptr, end);
    return ptr - reinterpret_cast<unsigned *>(buffer);
}